

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ChainPromiseNode::~ChainPromiseNode(ChainPromiseNode *this)

{
  AsyncObject *this_00;
  
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&this->inner);
  this_00 = (AsyncObject *)&this->super_Event;
  Event::~Event((Event *)this_00);
  AsyncObject::~AsyncObject(this_00);
  return;
}

Assistant:

ChainPromiseNode::~ChainPromiseNode() noexcept(false) {}